

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

BorderAmounts_EdgeSizes *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::BorderAmounts_EdgeSizes>
          (Arena *arena)

{
  BorderAmounts_EdgeSizes *this;
  
  if (arena == (Arena *)0x0) {
    this = (BorderAmounts_EdgeSizes *)operator_new(0x28);
    CoreML::Specification::BorderAmounts_EdgeSizes::BorderAmounts_EdgeSizes(this,(Arena *)0x0,false)
    ;
  }
  else {
    this = (BorderAmounts_EdgeSizes *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)&CoreML::Specification::BorderAmounts_EdgeSizes::typeinfo);
    CoreML::Specification::BorderAmounts_EdgeSizes::BorderAmounts_EdgeSizes(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }